

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::MultiHeadAttention_x86_avx512::create_pipeline
          (MultiHeadAttention_x86_avx512 *this,Option *_opt)

{
  long *plVar1;
  int *piVar2;
  undefined1 auVar3 [64];
  Layer *pLVar4;
  undefined8 *puVar5;
  void **ppvVar6;
  void *in_RSI;
  long in_RDI;
  undefined1 auVar7 [64];
  Option opt1_1;
  ParamDict pd_6;
  Option opt1;
  ParamDict pd_5;
  Mat out_weight_data_int8_scales;
  Mat weights_3 [3];
  ParamDict pd_4;
  Mat weights_2 [3];
  ParamDict pd_3;
  Mat weights_1 [3];
  ParamDict pd_2;
  Mat weights [3];
  ParamDict pd_1;
  int qdim;
  ParamDict pd;
  Option opt;
  ParamDict *in_stack_fffffffffffff1e0;
  undefined4 in_stack_fffffffffffff1e8;
  int in_stack_fffffffffffff1ec;
  size_t in_stack_fffffffffffff1f0;
  undefined4 in_stack_fffffffffffff1f8;
  int in_stack_fffffffffffff1fc;
  Mat *in_stack_fffffffffffff200;
  ModelBinFromMatArray *this_00;
  void **local_dc8;
  void **local_d20;
  void **local_cf8;
  void **local_c70;
  void **local_c48;
  void **local_bc0;
  void **local_b98;
  void **local_b30;
  undefined4 local_b08;
  undefined4 uStack_b04;
  undefined1 auStack_b00 [56];
  undefined1 local_ac8 [16];
  ParamDict local_ab8;
  undefined4 local_aa8;
  undefined4 uStack_aa4;
  undefined1 auStack_aa0 [56];
  undefined1 local_a60 [16];
  ParamDict local_a50;
  undefined1 local_a40 [16];
  undefined4 *local_a30;
  int *local_a28;
  undefined8 local_a20;
  undefined4 local_a18;
  long *local_a10;
  undefined4 local_a08;
  undefined4 local_a04;
  undefined4 local_a00;
  undefined4 local_9fc;
  undefined4 local_9f8;
  undefined8 local_9f0;
  void *local_9e8;
  int *local_9e0;
  void *local_9d8;
  undefined4 local_9d0;
  long *local_9c8;
  undefined4 local_9c0;
  undefined4 local_9bc;
  undefined4 local_9b8;
  undefined4 local_9b4;
  undefined4 local_9b0;
  void *local_9a8;
  void *local_9a0;
  int *local_998;
  void *local_990;
  undefined4 local_988;
  long *local_980;
  undefined4 local_978;
  undefined4 local_974;
  undefined4 local_970;
  undefined4 local_96c;
  undefined4 local_968;
  void *local_960;
  undefined4 *local_958;
  int *local_950;
  undefined4 *local_948;
  undefined4 local_940;
  long *local_938;
  undefined4 local_930;
  undefined4 local_92c;
  undefined4 local_928;
  undefined4 local_924;
  undefined4 local_920;
  undefined4 *local_918;
  void *pvStack_910;
  ParamDict local_908;
  undefined1 local_8f8 [16];
  void *local_8e8;
  int *local_8e0;
  void *local_8d8;
  undefined4 local_8d0;
  long *local_8c8;
  undefined4 local_8c0;
  undefined4 local_8bc;
  undefined4 local_8b8;
  undefined4 local_8b4;
  undefined4 local_8b0;
  void *local_8a8;
  void *local_8a0;
  int *local_898;
  void *local_890;
  undefined4 local_888;
  long *local_880;
  undefined4 local_878;
  undefined4 local_874;
  undefined4 local_870;
  undefined4 local_86c;
  undefined4 local_868;
  void *local_860;
  void *local_858;
  int *local_850;
  void *local_848;
  undefined4 local_840;
  long *local_838;
  undefined4 local_830;
  undefined4 local_82c;
  undefined4 local_828;
  undefined4 local_824;
  undefined4 local_820;
  void *local_818;
  void *pvStack_810;
  ParamDict local_808;
  undefined1 local_7f8 [16];
  void *local_7e8;
  int *local_7e0;
  void *local_7d8;
  undefined4 local_7d0;
  long *local_7c8;
  undefined4 local_7c0;
  undefined4 local_7bc;
  undefined4 local_7b8;
  undefined4 local_7b4;
  undefined4 local_7b0;
  void *local_7a8;
  void *local_7a0;
  int *local_798;
  void *local_790;
  undefined4 local_788;
  long *local_780;
  undefined4 local_778;
  undefined4 local_774;
  undefined4 local_770;
  undefined4 local_76c;
  undefined4 local_768;
  void *local_760;
  void *local_758;
  int *local_750;
  void *local_748;
  undefined4 local_740;
  long *local_738;
  undefined4 local_730;
  undefined4 local_72c;
  undefined4 local_728;
  undefined4 local_724;
  undefined4 local_720;
  void *local_718;
  void *pvStack_710;
  ParamDict local_708;
  undefined1 local_6f8 [16];
  void *local_6e8;
  int *local_6e0;
  void *local_6d8;
  undefined4 local_6d0;
  long *local_6c8;
  undefined4 local_6c0;
  undefined4 local_6bc;
  undefined4 local_6b8;
  undefined4 local_6b4;
  undefined4 local_6b0;
  void *local_6a8;
  void *local_6a0;
  int *local_698;
  void *local_690;
  undefined4 local_688;
  long *local_680;
  undefined4 local_678;
  undefined4 local_674;
  undefined4 local_670;
  undefined4 local_66c;
  undefined4 local_668;
  void *local_660;
  void *local_658;
  int *local_650;
  void *local_648;
  undefined4 local_640;
  long *local_638;
  undefined4 local_630;
  undefined4 local_62c;
  undefined4 local_628;
  undefined4 local_624;
  undefined4 local_620;
  void *local_618;
  void *pvStack_610;
  ParamDict local_608;
  int local_5f4;
  undefined1 local_5f0 [32];
  ParamDict local_5d0;
  byte local_5c0;
  undefined1 auStack_5bf [38];
  undefined1 uStack_599;
  undefined1 auStack_598 [24];
  void **local_570;
  void **local_568;
  void **local_560;
  void **local_558;
  void **local_548;
  void **local_530;
  void **local_518;
  undefined4 **local_500;
  void **local_4f0;
  int local_4e0;
  undefined4 local_4dc;
  undefined4 **local_4d8;
  undefined4 **local_4d0;
  undefined4 **local_4c8;
  int local_4c0;
  undefined4 local_4bc;
  void **local_4b8;
  void **local_4b0;
  void **local_4a8;
  int local_4a0;
  undefined4 local_49c;
  void **local_498;
  void **local_490;
  void **local_488;
  int local_480;
  undefined4 local_47c;
  void **local_478;
  void **local_470;
  void **local_468;
  int local_460;
  undefined4 local_45c;
  void **local_458;
  void **local_450;
  void **local_448;
  int local_440;
  undefined4 local_43c;
  void **local_438;
  void **local_430;
  void **local_428;
  int local_420;
  undefined4 local_41c;
  void **local_418;
  void **local_410;
  void **local_408;
  int local_400;
  undefined4 local_3fc;
  void **local_3f8;
  void **local_3f0;
  void **local_3e8;
  int local_3e0;
  undefined4 local_3dc;
  void **local_3d8;
  void **local_3d0;
  void **local_3c8;
  int local_3c0;
  undefined4 local_3bc;
  void **local_3b8;
  void **local_3b0;
  void **local_3a8;
  int local_3a0;
  undefined4 local_39c;
  void **local_398;
  void **local_390;
  void **local_388;
  int local_380;
  undefined4 local_37c;
  void **local_378;
  void **local_370;
  void **local_368;
  int local_360;
  undefined4 local_35c;
  void **local_358;
  int local_350;
  undefined4 local_34c;
  void **local_348;
  int local_340;
  undefined4 local_33c;
  void **local_338;
  int local_330;
  undefined4 local_32c;
  void **local_328;
  int local_320;
  undefined4 local_31c;
  void **local_318;
  int local_310;
  undefined4 local_30c;
  void **local_308;
  int local_300;
  undefined4 local_2fc;
  void **local_2f8;
  int local_2f0;
  undefined4 local_2ec;
  void **local_2e8;
  int local_2e0;
  undefined4 local_2dc;
  void **local_2d8;
  int local_2d0;
  undefined4 local_2cc;
  void **local_2c8;
  int local_2c0;
  undefined4 local_2bc;
  void **local_2b8;
  int local_2b0;
  undefined4 local_2ac;
  undefined4 **local_2a8;
  int local_290;
  undefined4 local_28c;
  void **local_288;
  int local_270;
  undefined4 local_26c;
  undefined4 **local_268;
  int local_240;
  undefined4 local_23c;
  void **local_238;
  int local_210;
  undefined4 local_20c;
  void **local_208;
  int local_1e0;
  undefined4 local_1dc;
  void **local_1d8;
  int local_1c0;
  undefined4 local_1bc;
  undefined8 *local_1b8;
  int local_1b0;
  undefined4 local_1ac;
  undefined8 *local_1a8;
  int local_1a0;
  undefined4 local_19c;
  undefined8 *local_198;
  int local_190;
  undefined4 local_18c;
  undefined8 *local_188;
  int local_180;
  undefined4 local_17c;
  undefined8 *local_178;
  int local_170;
  undefined4 local_16c;
  undefined8 *local_168;
  int local_160;
  undefined4 local_15c;
  undefined8 *local_158;
  int local_150;
  undefined4 local_14c;
  undefined8 *local_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined4 local_12c;
  undefined4 **local_128;
  undefined8 local_120;
  undefined4 **local_118;
  void *local_110;
  void *local_108;
  void *local_100;
  void *local_f8;
  void *local_f0;
  void *local_e8;
  void *local_e0;
  void *local_d8;
  void *local_c8;
  void *local_b0;
  void *local_98;
  undefined4 *local_80;
  void *local_70;
  
  memcpy(&local_5c0,in_RSI,0x40);
  if (*(int *)(in_RDI + 0xec) != 0) {
    *(undefined1 *)(in_RDI + 0xb) = 0;
    uStack_599 = 0;
  }
  pLVar4 = create_layer_cpu(in_stack_fffffffffffff1ec);
  *(Layer **)(in_RDI + 0x440) = pLVar4;
  ParamDict::ParamDict((ParamDict *)in_stack_fffffffffffff200);
  ParamDict::set(&local_5d0,0,-1);
  ParamDict::set(&local_5d0,1,1);
  (**(code **)(**(long **)(in_RDI + 0x440) + 0x10))(*(long **)(in_RDI + 0x440),&local_5d0);
  plVar1 = *(long **)(in_RDI + 0x440);
  ModelBinFromMatArray::ModelBinFromMatArray
            ((ModelBinFromMatArray *)in_stack_fffffffffffff200,
             (Mat *)CONCAT44(in_stack_fffffffffffff1fc,in_stack_fffffffffffff1f8));
  (**(code **)(*plVar1 + 0x18))(plVar1,local_5f0);
  ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)in_stack_fffffffffffff1e0);
  (**(code **)(**(long **)(in_RDI + 0x440) + 0x20))();
  ParamDict::~ParamDict(in_stack_fffffffffffff1e0);
  local_5f4 = *(int *)(in_RDI + 0xd8) / *(int *)(in_RDI + 0xd0);
  pLVar4 = create_layer_cpu(in_stack_fffffffffffff1ec);
  *(Layer **)(in_RDI + 0x410) = pLVar4;
  ParamDict::ParamDict((ParamDict *)in_stack_fffffffffffff200);
  ParamDict::set(&local_608,0,*(float *)(in_RDI + 0xe8));
  ParamDict::set(&local_608,1,1.0);
  ParamDict::set(&local_608,2,0);
  ParamDict::set(&local_608,3,1);
  ParamDict::set(&local_608,4,1);
  ParamDict::set(&local_608,5,0);
  ParamDict::set(&local_608,6,1);
  ParamDict::set(&local_608,7,*(int *)(in_RDI + 0xd0));
  ParamDict::set(&local_608,8,0);
  ParamDict::set(&local_608,9,local_5f4);
  ParamDict::set(&local_608,10,1);
  ParamDict::set(&local_608,0xb,0);
  ParamDict::set(&local_608,0xc,1);
  ParamDict::set(&local_608,0xe,0);
  ParamDict::set(&local_608,0x12,*(int *)(in_RDI + 0xec));
  (**(code **)(**(long **)(in_RDI + 0x410) + 0x10))(*(long **)(in_RDI + 0x410),&local_608);
  local_b30 = &local_6e8;
  do {
    local_570 = local_b30;
    *local_b30 = (void *)0x0;
    local_b30[1] = (void *)0x0;
    local_b30[2] = (void *)0x0;
    *(undefined4 *)(local_b30 + 3) = 0;
    local_b30[4] = (void *)0x0;
    *(undefined4 *)(local_b30 + 5) = 0;
    *(undefined4 *)((long)local_b30 + 0x2c) = 0;
    *(undefined4 *)(local_b30 + 6) = 0;
    *(undefined4 *)((long)local_b30 + 0x34) = 0;
    *(undefined4 *)(local_b30 + 7) = 0;
    local_b30[8] = (void *)0x0;
    local_b30 = local_b30 + 9;
  } while (local_b30 != &pvStack_610);
  local_378 = (void **)(in_RDI + 0xf0);
  local_370 = &local_6e8;
  if (&local_6e8 != local_378) {
    if (*(long *)(in_RDI + 0xf8) != 0) {
      piVar2 = *(int **)(in_RDI + 0xf8);
      local_37c = 1;
      LOCK();
      local_380 = *piVar2;
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    local_358 = &local_6e8;
    if (local_6e0 != (int *)0x0) {
      local_35c = 0xffffffff;
      LOCK();
      local_360 = *local_6e0;
      *local_6e0 = *local_6e0 + -1;
      UNLOCK();
      if (local_360 == 1) {
        if (local_6c8 == (long *)0x0) {
          if (local_6e8 != (void *)0x0) {
            free(local_6e8);
          }
        }
        else {
          (**(code **)(*local_6c8 + 0x18))(local_6c8,local_6e8);
        }
      }
    }
    local_6e8 = *local_378;
    local_6e0 = (int *)local_378[1];
    local_6d8 = local_378[2];
    local_6d0 = *(undefined4 *)(local_378 + 3);
    local_6c8 = (long *)local_378[4];
    local_6c0 = *(undefined4 *)(local_378 + 5);
    local_6bc = *(undefined4 *)((long)local_378 + 0x2c);
    local_6b8 = *(undefined4 *)(local_378 + 6);
    local_6b4 = *(undefined4 *)((long)local_378 + 0x34);
    local_6b0 = *(undefined4 *)(local_378 + 7);
    local_6a8 = local_378[8];
  }
  local_398 = (void **)(in_RDI + 0x138);
  local_390 = &local_6a0;
  local_368 = &local_6e8;
  if (&local_6a0 != local_398) {
    if (*(long *)(in_RDI + 0x140) != 0) {
      piVar2 = *(int **)(in_RDI + 0x140);
      local_39c = 1;
      LOCK();
      local_3a0 = *piVar2;
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    local_348 = &local_6a0;
    if (local_698 != (int *)0x0) {
      local_34c = 0xffffffff;
      LOCK();
      local_350 = *local_698;
      *local_698 = *local_698 + -1;
      UNLOCK();
      if (local_350 == 1) {
        if (local_680 == (long *)0x0) {
          if (local_6a0 != (void *)0x0) {
            free(local_6a0);
          }
        }
        else {
          (**(code **)(*local_680 + 0x18))(local_680,local_6a0);
        }
      }
    }
    local_6a0 = *local_398;
    local_698 = (int *)local_398[1];
    local_690 = local_398[2];
    local_688 = *(undefined4 *)(local_398 + 3);
    local_680 = (long *)local_398[4];
    local_678 = *(undefined4 *)(local_398 + 5);
    local_674 = *(undefined4 *)((long)local_398 + 0x2c);
    local_670 = *(undefined4 *)(local_398 + 6);
    local_66c = *(undefined4 *)((long)local_398 + 0x34);
    local_668 = *(undefined4 *)(local_398 + 7);
    local_660 = local_398[8];
  }
  local_3b8 = (void **)(in_RDI + 0x330);
  local_3b0 = &local_658;
  local_388 = &local_6a0;
  if (&local_658 != local_3b8) {
    if (*(long *)(in_RDI + 0x338) != 0) {
      piVar2 = *(int **)(in_RDI + 0x338);
      local_3bc = 1;
      LOCK();
      local_3c0 = *piVar2;
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    local_338 = &local_658;
    if (local_650 != (int *)0x0) {
      local_33c = 0xffffffff;
      LOCK();
      local_340 = *local_650;
      *local_650 = *local_650 + -1;
      UNLOCK();
      if (local_340 == 1) {
        if (local_638 == (long *)0x0) {
          if (local_658 != (void *)0x0) {
            free(local_658);
          }
        }
        else {
          (**(code **)(*local_638 + 0x18))(local_638,local_658);
        }
      }
    }
    local_658 = *local_3b8;
    local_650 = (int *)local_3b8[1];
    local_648 = local_3b8[2];
    local_640 = *(undefined4 *)(local_3b8 + 3);
    local_638 = (long *)local_3b8[4];
    local_630 = *(undefined4 *)(local_3b8 + 5);
    local_62c = *(undefined4 *)((long)local_3b8 + 0x2c);
    local_628 = *(undefined4 *)(local_3b8 + 6);
    local_624 = *(undefined4 *)((long)local_3b8 + 0x34);
    local_620 = *(undefined4 *)(local_3b8 + 7);
    local_618 = local_3b8[8];
  }
  plVar1 = *(long **)(in_RDI + 0x410);
  local_3a8 = &local_658;
  ModelBinFromMatArray::ModelBinFromMatArray
            ((ModelBinFromMatArray *)in_stack_fffffffffffff200,
             (Mat *)CONCAT44(in_stack_fffffffffffff1fc,in_stack_fffffffffffff1f8));
  (**(code **)(*plVar1 + 0x18))(plVar1,local_6f8);
  ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)in_stack_fffffffffffff1e0);
  (**(code **)(**(long **)(in_RDI + 0x410) + 0x20))(*(long **)(in_RDI + 0x410),&local_5c0);
  if ((local_5c0 & 1) != 0) {
    puVar5 = (undefined8 *)(in_RDI + 0xf0);
    local_148 = puVar5;
    if (*(long *)(in_RDI + 0xf8) != 0) {
      piVar2 = *(int **)(in_RDI + 0xf8);
      local_14c = 0xffffffff;
      LOCK();
      local_150 = *piVar2;
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (local_150 == 1) {
        if (*(long *)(in_RDI + 0x110) == 0) {
          local_110 = (void *)*puVar5;
          if (local_110 != (void *)0x0) {
            free(local_110);
          }
        }
        else {
          (**(code **)(**(long **)(in_RDI + 0x110) + 0x18))(*(long **)(in_RDI + 0x110),*puVar5);
        }
      }
    }
    *puVar5 = 0;
    *(undefined8 *)(in_RDI + 0x100) = 0;
    *(undefined4 *)(in_RDI + 0x108) = 0;
    *(undefined4 *)(in_RDI + 0x118) = 0;
    *(undefined4 *)(in_RDI + 0x11c) = 0;
    *(undefined4 *)(in_RDI + 0x120) = 0;
    *(undefined4 *)(in_RDI + 0x124) = 0;
    *(undefined4 *)(in_RDI + 0x128) = 0;
    *(undefined8 *)(in_RDI + 0x130) = 0;
    *(undefined8 *)(in_RDI + 0xf8) = 0;
    puVar5 = (undefined8 *)(in_RDI + 0x138);
    local_158 = puVar5;
    if (*(long *)(in_RDI + 0x140) != 0) {
      piVar2 = *(int **)(in_RDI + 0x140);
      local_15c = 0xffffffff;
      LOCK();
      local_160 = *piVar2;
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (local_160 == 1) {
        if (*(long *)(in_RDI + 0x158) == 0) {
          local_108 = (void *)*puVar5;
          if (local_108 != (void *)0x0) {
            free(local_108);
          }
        }
        else {
          (**(code **)(**(long **)(in_RDI + 0x158) + 0x18))(*(long **)(in_RDI + 0x158),*puVar5);
        }
      }
    }
    *puVar5 = 0;
    *(undefined8 *)(in_RDI + 0x148) = 0;
    *(undefined4 *)(in_RDI + 0x150) = 0;
    *(undefined4 *)(in_RDI + 0x160) = 0;
    *(undefined4 *)(in_RDI + 0x164) = 0;
    *(undefined4 *)(in_RDI + 0x168) = 0;
    *(undefined4 *)(in_RDI + 0x16c) = 0;
    *(undefined4 *)(in_RDI + 0x170) = 0;
    *(undefined8 *)(in_RDI + 0x178) = 0;
    *(undefined8 *)(in_RDI + 0x140) = 0;
  }
  local_b98 = &pvStack_610;
  do {
    ppvVar6 = local_b98 + -9;
    local_548 = ppvVar6;
    local_1d8 = ppvVar6;
    if (local_b98[-8] != (void *)0x0) {
      piVar2 = (int *)local_b98[-8];
      local_1dc = 0xffffffff;
      LOCK();
      local_1e0 = *piVar2;
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (local_1e0 == 1) {
        if (local_b98[-5] == (void *)0x0) {
          local_c8 = *ppvVar6;
          if (local_c8 != (void *)0x0) {
            free(local_c8);
          }
        }
        else {
          (**(code **)(*local_b98[-5] + 0x18))(local_b98[-5],*ppvVar6);
        }
      }
    }
    *ppvVar6 = (void *)0x0;
    local_b98[-7] = (void *)0x0;
    *(undefined4 *)(local_b98 + -6) = 0;
    *(undefined4 *)(local_b98 + -4) = 0;
    *(undefined4 *)((long)local_b98 + -0x1c) = 0;
    *(undefined4 *)(local_b98 + -3) = 0;
    *(undefined4 *)((long)local_b98 + -0x14) = 0;
    *(undefined4 *)(local_b98 + -2) = 0;
    local_b98[-1] = (void *)0x0;
    local_b98[-8] = (void *)0x0;
    local_b98 = ppvVar6;
  } while (ppvVar6 != &local_6e8);
  ParamDict::~ParamDict(in_stack_fffffffffffff1e0);
  pLVar4 = create_layer_cpu(in_stack_fffffffffffff1ec);
  *(Layer **)(in_RDI + 0x418) = pLVar4;
  ParamDict::ParamDict((ParamDict *)in_stack_fffffffffffff200);
  ParamDict::set(&local_708,2,0);
  ParamDict::set(&local_708,3,1);
  ParamDict::set(&local_708,4,1);
  ParamDict::set(&local_708,5,0);
  ParamDict::set(&local_708,6,1);
  ParamDict::set(&local_708,7,*(int *)(in_RDI + 0xd0));
  ParamDict::set(&local_708,8,0);
  ParamDict::set(&local_708,9,*(int *)(in_RDI + 0xdc));
  ParamDict::set(&local_708,10,1);
  ParamDict::set(&local_708,0xb,0);
  ParamDict::set(&local_708,0xc,1);
  ParamDict::set(&local_708,0xe,0);
  ParamDict::set(&local_708,0x12,*(int *)(in_RDI + 0xec));
  (**(code **)(**(long **)(in_RDI + 0x418) + 0x10))(*(long **)(in_RDI + 0x418),&local_708);
  local_bc0 = &local_7e8;
  do {
    local_568 = local_bc0;
    *local_bc0 = (void *)0x0;
    local_bc0[1] = (void *)0x0;
    local_bc0[2] = (void *)0x0;
    *(undefined4 *)(local_bc0 + 3) = 0;
    local_bc0[4] = (void *)0x0;
    *(undefined4 *)(local_bc0 + 5) = 0;
    *(undefined4 *)((long)local_bc0 + 0x2c) = 0;
    *(undefined4 *)(local_bc0 + 6) = 0;
    *(undefined4 *)((long)local_bc0 + 0x34) = 0;
    *(undefined4 *)(local_bc0 + 7) = 0;
    local_bc0[8] = (void *)0x0;
    local_bc0 = local_bc0 + 9;
  } while (local_bc0 != &pvStack_710);
  local_3d8 = (void **)(in_RDI + 0x180);
  local_3d0 = &local_7e8;
  if (&local_7e8 != local_3d8) {
    if (*(long *)(in_RDI + 0x188) != 0) {
      piVar2 = *(int **)(in_RDI + 0x188);
      local_3dc = 1;
      LOCK();
      local_3e0 = *piVar2;
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    local_328 = &local_7e8;
    if (local_7e0 != (int *)0x0) {
      local_32c = 0xffffffff;
      LOCK();
      local_330 = *local_7e0;
      *local_7e0 = *local_7e0 + -1;
      UNLOCK();
      if (local_330 == 1) {
        if (local_7c8 == (long *)0x0) {
          if (local_7e8 != (void *)0x0) {
            free(local_7e8);
          }
        }
        else {
          (**(code **)(*local_7c8 + 0x18))(local_7c8,local_7e8);
        }
      }
    }
    local_7e8 = *local_3d8;
    local_7e0 = (int *)local_3d8[1];
    local_7d8 = local_3d8[2];
    local_7d0 = *(undefined4 *)(local_3d8 + 3);
    local_7c8 = (long *)local_3d8[4];
    local_7c0 = *(undefined4 *)(local_3d8 + 5);
    local_7bc = *(undefined4 *)((long)local_3d8 + 0x2c);
    local_7b8 = *(undefined4 *)(local_3d8 + 6);
    local_7b4 = *(undefined4 *)((long)local_3d8 + 0x34);
    local_7b0 = *(undefined4 *)(local_3d8 + 7);
    local_7a8 = local_3d8[8];
  }
  local_3f8 = (void **)(in_RDI + 0x1c8);
  local_3f0 = &local_7a0;
  local_3c8 = &local_7e8;
  if (&local_7a0 != local_3f8) {
    if (*(long *)(in_RDI + 0x1d0) != 0) {
      piVar2 = *(int **)(in_RDI + 0x1d0);
      local_3fc = 1;
      LOCK();
      local_400 = *piVar2;
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    local_318 = &local_7a0;
    if (local_798 != (int *)0x0) {
      local_31c = 0xffffffff;
      LOCK();
      local_320 = *local_798;
      *local_798 = *local_798 + -1;
      UNLOCK();
      if (local_320 == 1) {
        if (local_780 == (long *)0x0) {
          if (local_7a0 != (void *)0x0) {
            free(local_7a0);
          }
        }
        else {
          (**(code **)(*local_780 + 0x18))(local_780,local_7a0);
        }
      }
    }
    local_7a0 = *local_3f8;
    local_798 = (int *)local_3f8[1];
    local_790 = local_3f8[2];
    local_788 = *(undefined4 *)(local_3f8 + 3);
    local_780 = (long *)local_3f8[4];
    local_778 = *(undefined4 *)(local_3f8 + 5);
    local_774 = *(undefined4 *)((long)local_3f8 + 0x2c);
    local_770 = *(undefined4 *)(local_3f8 + 6);
    local_76c = *(undefined4 *)((long)local_3f8 + 0x34);
    local_768 = *(undefined4 *)(local_3f8 + 7);
    local_760 = local_3f8[8];
  }
  local_418 = (void **)(in_RDI + 0x378);
  local_410 = &local_758;
  local_3e8 = &local_7a0;
  if (&local_758 != local_418) {
    if (*(long *)(in_RDI + 0x380) != 0) {
      piVar2 = *(int **)(in_RDI + 0x380);
      local_41c = 1;
      LOCK();
      local_420 = *piVar2;
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    local_308 = &local_758;
    if (local_750 != (int *)0x0) {
      local_30c = 0xffffffff;
      LOCK();
      local_310 = *local_750;
      *local_750 = *local_750 + -1;
      UNLOCK();
      if (local_310 == 1) {
        if (local_738 == (long *)0x0) {
          if (local_758 != (void *)0x0) {
            free(local_758);
          }
        }
        else {
          (**(code **)(*local_738 + 0x18))(local_738,local_758);
        }
      }
    }
    local_758 = *local_418;
    local_750 = (int *)local_418[1];
    local_748 = local_418[2];
    local_740 = *(undefined4 *)(local_418 + 3);
    local_738 = (long *)local_418[4];
    local_730 = *(undefined4 *)(local_418 + 5);
    local_72c = *(undefined4 *)((long)local_418 + 0x2c);
    local_728 = *(undefined4 *)(local_418 + 6);
    local_724 = *(undefined4 *)((long)local_418 + 0x34);
    local_720 = *(undefined4 *)(local_418 + 7);
    local_718 = local_418[8];
  }
  plVar1 = *(long **)(in_RDI + 0x418);
  local_408 = &local_758;
  ModelBinFromMatArray::ModelBinFromMatArray
            ((ModelBinFromMatArray *)in_stack_fffffffffffff200,
             (Mat *)CONCAT44(in_stack_fffffffffffff1fc,in_stack_fffffffffffff1f8));
  (**(code **)(*plVar1 + 0x18))(plVar1,local_7f8);
  ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)in_stack_fffffffffffff1e0);
  (**(code **)(**(long **)(in_RDI + 0x418) + 0x20))(*(long **)(in_RDI + 0x418),&local_5c0);
  if ((local_5c0 & 1) != 0) {
    puVar5 = (undefined8 *)(in_RDI + 0x180);
    local_168 = puVar5;
    if (*(long *)(in_RDI + 0x188) != 0) {
      piVar2 = *(int **)(in_RDI + 0x188);
      local_16c = 0xffffffff;
      LOCK();
      local_170 = *piVar2;
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (local_170 == 1) {
        if (*(long *)(in_RDI + 0x1a0) == 0) {
          local_100 = (void *)*puVar5;
          if (local_100 != (void *)0x0) {
            free(local_100);
          }
        }
        else {
          (**(code **)(**(long **)(in_RDI + 0x1a0) + 0x18))(*(long **)(in_RDI + 0x1a0),*puVar5);
        }
      }
    }
    *puVar5 = 0;
    *(undefined8 *)(in_RDI + 400) = 0;
    *(undefined4 *)(in_RDI + 0x198) = 0;
    *(undefined4 *)(in_RDI + 0x1a8) = 0;
    *(undefined4 *)(in_RDI + 0x1ac) = 0;
    *(undefined4 *)(in_RDI + 0x1b0) = 0;
    *(undefined4 *)(in_RDI + 0x1b4) = 0;
    *(undefined4 *)(in_RDI + 0x1b8) = 0;
    *(undefined8 *)(in_RDI + 0x1c0) = 0;
    *(undefined8 *)(in_RDI + 0x188) = 0;
    puVar5 = (undefined8 *)(in_RDI + 0x1c8);
    local_178 = puVar5;
    if (*(long *)(in_RDI + 0x1d0) != 0) {
      piVar2 = *(int **)(in_RDI + 0x1d0);
      local_17c = 0xffffffff;
      LOCK();
      local_180 = *piVar2;
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (local_180 == 1) {
        if (*(long *)(in_RDI + 0x1e8) == 0) {
          local_f8 = (void *)*puVar5;
          if (local_f8 != (void *)0x0) {
            free(local_f8);
          }
        }
        else {
          (**(code **)(**(long **)(in_RDI + 0x1e8) + 0x18))(*(long **)(in_RDI + 0x1e8),*puVar5);
        }
      }
    }
    *puVar5 = 0;
    *(undefined8 *)(in_RDI + 0x1d8) = 0;
    *(undefined4 *)(in_RDI + 0x1e0) = 0;
    *(undefined4 *)(in_RDI + 0x1f0) = 0;
    *(undefined4 *)(in_RDI + 500) = 0;
    *(undefined4 *)(in_RDI + 0x1f8) = 0;
    *(undefined4 *)(in_RDI + 0x1fc) = 0;
    *(undefined4 *)(in_RDI + 0x200) = 0;
    *(undefined8 *)(in_RDI + 0x208) = 0;
    *(undefined8 *)(in_RDI + 0x1d0) = 0;
  }
  local_c48 = &pvStack_710;
  do {
    ppvVar6 = local_c48 + -9;
    local_530 = ppvVar6;
    local_208 = ppvVar6;
    if (local_c48[-8] != (void *)0x0) {
      piVar2 = (int *)local_c48[-8];
      local_20c = 0xffffffff;
      LOCK();
      local_210 = *piVar2;
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (local_210 == 1) {
        if (local_c48[-5] == (void *)0x0) {
          local_b0 = *ppvVar6;
          if (local_b0 != (void *)0x0) {
            free(local_b0);
          }
        }
        else {
          (**(code **)(*local_c48[-5] + 0x18))(local_c48[-5],*ppvVar6);
        }
      }
    }
    *ppvVar6 = (void *)0x0;
    local_c48[-7] = (void *)0x0;
    *(undefined4 *)(local_c48 + -6) = 0;
    *(undefined4 *)(local_c48 + -4) = 0;
    *(undefined4 *)((long)local_c48 + -0x1c) = 0;
    *(undefined4 *)(local_c48 + -3) = 0;
    *(undefined4 *)((long)local_c48 + -0x14) = 0;
    *(undefined4 *)(local_c48 + -2) = 0;
    local_c48[-1] = (void *)0x0;
    local_c48[-8] = (void *)0x0;
    local_c48 = ppvVar6;
  } while (ppvVar6 != &local_7e8);
  ParamDict::~ParamDict(in_stack_fffffffffffff1e0);
  pLVar4 = create_layer_cpu(in_stack_fffffffffffff1ec);
  *(Layer **)(in_RDI + 0x420) = pLVar4;
  ParamDict::ParamDict((ParamDict *)in_stack_fffffffffffff200);
  ParamDict::set(&local_808,2,0);
  ParamDict::set(&local_808,3,1);
  ParamDict::set(&local_808,4,1);
  ParamDict::set(&local_808,5,0);
  ParamDict::set(&local_808,6,1);
  ParamDict::set(&local_808,7,*(int *)(in_RDI + 0xd0));
  ParamDict::set(&local_808,8,0);
  ParamDict::set(&local_808,9,*(int *)(in_RDI + 0xe0));
  ParamDict::set(&local_808,10,1);
  ParamDict::set(&local_808,0xb,0);
  ParamDict::set(&local_808,0xc,1);
  ParamDict::set(&local_808,0xe,0);
  ParamDict::set(&local_808,0x12,*(int *)(in_RDI + 0xec));
  (**(code **)(**(long **)(in_RDI + 0x420) + 0x10))(*(long **)(in_RDI + 0x420),&local_808);
  local_c70 = &local_8e8;
  do {
    local_560 = local_c70;
    *local_c70 = (void *)0x0;
    local_c70[1] = (void *)0x0;
    local_c70[2] = (void *)0x0;
    *(undefined4 *)(local_c70 + 3) = 0;
    local_c70[4] = (void *)0x0;
    *(undefined4 *)(local_c70 + 5) = 0;
    *(undefined4 *)((long)local_c70 + 0x2c) = 0;
    *(undefined4 *)(local_c70 + 6) = 0;
    *(undefined4 *)((long)local_c70 + 0x34) = 0;
    *(undefined4 *)(local_c70 + 7) = 0;
    local_c70[8] = (void *)0x0;
    local_c70 = local_c70 + 9;
  } while (local_c70 != &pvStack_810);
  local_438 = (void **)(in_RDI + 0x210);
  local_430 = &local_8e8;
  if (&local_8e8 != local_438) {
    if (*(long *)(in_RDI + 0x218) != 0) {
      piVar2 = *(int **)(in_RDI + 0x218);
      local_43c = 1;
      LOCK();
      local_440 = *piVar2;
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    local_2f8 = &local_8e8;
    if (local_8e0 != (int *)0x0) {
      local_2fc = 0xffffffff;
      LOCK();
      local_300 = *local_8e0;
      *local_8e0 = *local_8e0 + -1;
      UNLOCK();
      if (local_300 == 1) {
        if (local_8c8 == (long *)0x0) {
          if (local_8e8 != (void *)0x0) {
            free(local_8e8);
          }
        }
        else {
          (**(code **)(*local_8c8 + 0x18))(local_8c8,local_8e8);
        }
      }
    }
    local_8e8 = *local_438;
    local_8e0 = (int *)local_438[1];
    local_8d8 = local_438[2];
    local_8d0 = *(undefined4 *)(local_438 + 3);
    local_8c8 = (long *)local_438[4];
    local_8c0 = *(undefined4 *)(local_438 + 5);
    local_8bc = *(undefined4 *)((long)local_438 + 0x2c);
    local_8b8 = *(undefined4 *)(local_438 + 6);
    local_8b4 = *(undefined4 *)((long)local_438 + 0x34);
    local_8b0 = *(undefined4 *)(local_438 + 7);
    local_8a8 = local_438[8];
  }
  local_458 = (void **)(in_RDI + 600);
  local_450 = &local_8a0;
  local_428 = &local_8e8;
  if (&local_8a0 != local_458) {
    if (*(long *)(in_RDI + 0x260) != 0) {
      piVar2 = *(int **)(in_RDI + 0x260);
      local_45c = 1;
      LOCK();
      local_460 = *piVar2;
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    local_2e8 = &local_8a0;
    if (local_898 != (int *)0x0) {
      local_2ec = 0xffffffff;
      LOCK();
      local_2f0 = *local_898;
      *local_898 = *local_898 + -1;
      UNLOCK();
      if (local_2f0 == 1) {
        if (local_880 == (long *)0x0) {
          if (local_8a0 != (void *)0x0) {
            free(local_8a0);
          }
        }
        else {
          (**(code **)(*local_880 + 0x18))(local_880,local_8a0);
        }
      }
    }
    local_8a0 = *local_458;
    local_898 = (int *)local_458[1];
    local_890 = local_458[2];
    local_888 = *(undefined4 *)(local_458 + 3);
    local_880 = (long *)local_458[4];
    local_878 = *(undefined4 *)(local_458 + 5);
    local_874 = *(undefined4 *)((long)local_458 + 0x2c);
    local_870 = *(undefined4 *)(local_458 + 6);
    local_86c = *(undefined4 *)((long)local_458 + 0x34);
    local_868 = *(undefined4 *)(local_458 + 7);
    local_860 = local_458[8];
  }
  local_478 = (void **)(in_RDI + 0x3c0);
  local_470 = &local_858;
  local_448 = &local_8a0;
  if (&local_858 != local_478) {
    if (*(long *)(in_RDI + 0x3c8) != 0) {
      piVar2 = *(int **)(in_RDI + 0x3c8);
      local_47c = 1;
      LOCK();
      local_480 = *piVar2;
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    local_2d8 = &local_858;
    if (local_850 != (int *)0x0) {
      local_2dc = 0xffffffff;
      LOCK();
      local_2e0 = *local_850;
      *local_850 = *local_850 + -1;
      UNLOCK();
      if (local_2e0 == 1) {
        if (local_838 == (long *)0x0) {
          if (local_858 != (void *)0x0) {
            free(local_858);
          }
        }
        else {
          (**(code **)(*local_838 + 0x18))(local_838,local_858);
        }
      }
    }
    local_858 = *local_478;
    local_850 = (int *)local_478[1];
    local_848 = local_478[2];
    local_840 = *(undefined4 *)(local_478 + 3);
    local_838 = (long *)local_478[4];
    local_830 = *(undefined4 *)(local_478 + 5);
    local_82c = *(undefined4 *)((long)local_478 + 0x2c);
    local_828 = *(undefined4 *)(local_478 + 6);
    local_824 = *(undefined4 *)((long)local_478 + 0x34);
    local_820 = *(undefined4 *)(local_478 + 7);
    local_818 = local_478[8];
  }
  plVar1 = *(long **)(in_RDI + 0x420);
  local_468 = &local_858;
  ModelBinFromMatArray::ModelBinFromMatArray
            ((ModelBinFromMatArray *)in_stack_fffffffffffff200,
             (Mat *)CONCAT44(in_stack_fffffffffffff1fc,in_stack_fffffffffffff1f8));
  (**(code **)(*plVar1 + 0x18))(plVar1,local_8f8);
  ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)in_stack_fffffffffffff1e0);
  (**(code **)(**(long **)(in_RDI + 0x420) + 0x20))(*(long **)(in_RDI + 0x420),&local_5c0);
  if ((local_5c0 & 1) != 0) {
    puVar5 = (undefined8 *)(in_RDI + 0x210);
    local_188 = puVar5;
    if (*(long *)(in_RDI + 0x218) != 0) {
      piVar2 = *(int **)(in_RDI + 0x218);
      local_18c = 0xffffffff;
      LOCK();
      local_190 = *piVar2;
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (local_190 == 1) {
        if (*(long *)(in_RDI + 0x230) == 0) {
          local_f0 = (void *)*puVar5;
          if (local_f0 != (void *)0x0) {
            free(local_f0);
          }
        }
        else {
          (**(code **)(**(long **)(in_RDI + 0x230) + 0x18))(*(long **)(in_RDI + 0x230),*puVar5);
        }
      }
    }
    *puVar5 = 0;
    *(undefined8 *)(in_RDI + 0x220) = 0;
    *(undefined4 *)(in_RDI + 0x228) = 0;
    *(undefined4 *)(in_RDI + 0x238) = 0;
    *(undefined4 *)(in_RDI + 0x23c) = 0;
    *(undefined4 *)(in_RDI + 0x240) = 0;
    *(undefined4 *)(in_RDI + 0x244) = 0;
    *(undefined4 *)(in_RDI + 0x248) = 0;
    *(undefined8 *)(in_RDI + 0x250) = 0;
    *(undefined8 *)(in_RDI + 0x218) = 0;
    puVar5 = (undefined8 *)(in_RDI + 600);
    local_198 = puVar5;
    if (*(long *)(in_RDI + 0x260) != 0) {
      piVar2 = *(int **)(in_RDI + 0x260);
      local_19c = 0xffffffff;
      LOCK();
      local_1a0 = *piVar2;
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (local_1a0 == 1) {
        if (*(long *)(in_RDI + 0x278) == 0) {
          local_e8 = (void *)*puVar5;
          if (local_e8 != (void *)0x0) {
            free(local_e8);
          }
        }
        else {
          (**(code **)(**(long **)(in_RDI + 0x278) + 0x18))(*(long **)(in_RDI + 0x278),*puVar5);
        }
      }
    }
    *puVar5 = 0;
    *(undefined8 *)(in_RDI + 0x268) = 0;
    *(undefined4 *)(in_RDI + 0x270) = 0;
    *(undefined4 *)(in_RDI + 0x280) = 0;
    *(undefined4 *)(in_RDI + 0x284) = 0;
    *(undefined4 *)(in_RDI + 0x288) = 0;
    *(undefined4 *)(in_RDI + 0x28c) = 0;
    *(undefined4 *)(in_RDI + 0x290) = 0;
    *(undefined8 *)(in_RDI + 0x298) = 0;
    *(undefined8 *)(in_RDI + 0x260) = 0;
  }
  local_cf8 = &pvStack_810;
  do {
    ppvVar6 = local_cf8 + -9;
    local_518 = ppvVar6;
    local_238 = ppvVar6;
    if (local_cf8[-8] != (void *)0x0) {
      piVar2 = (int *)local_cf8[-8];
      local_23c = 0xffffffff;
      LOCK();
      local_240 = *piVar2;
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (local_240 == 1) {
        if (local_cf8[-5] == (void *)0x0) {
          local_98 = *ppvVar6;
          if (local_98 != (void *)0x0) {
            free(local_98);
          }
        }
        else {
          (**(code **)(*local_cf8[-5] + 0x18))(local_cf8[-5],*ppvVar6);
        }
      }
    }
    *ppvVar6 = (void *)0x0;
    local_cf8[-7] = (void *)0x0;
    *(undefined4 *)(local_cf8 + -6) = 0;
    *(undefined4 *)(local_cf8 + -4) = 0;
    *(undefined4 *)((long)local_cf8 + -0x1c) = 0;
    *(undefined4 *)(local_cf8 + -3) = 0;
    *(undefined4 *)((long)local_cf8 + -0x14) = 0;
    *(undefined4 *)(local_cf8 + -2) = 0;
    local_cf8[-1] = (void *)0x0;
    local_cf8[-8] = (void *)0x0;
    local_cf8 = ppvVar6;
  } while (ppvVar6 != &local_8e8);
  ParamDict::~ParamDict(in_stack_fffffffffffff1e0);
  pLVar4 = create_layer_cpu(in_stack_fffffffffffff1ec);
  *(Layer **)(in_RDI + 0x428) = pLVar4;
  ParamDict::ParamDict((ParamDict *)in_stack_fffffffffffff200);
  ParamDict::set(&local_908,2,1);
  ParamDict::set(&local_908,3,1);
  ParamDict::set(&local_908,4,0);
  ParamDict::set(&local_908,5,1);
  ParamDict::set(&local_908,6,1);
  ParamDict::set(&local_908,7,0);
  ParamDict::set(&local_908,8,local_5f4);
  ParamDict::set(&local_908,9,*(int *)(in_RDI + 0xd0));
  ParamDict::set(&local_908,10,4);
  ParamDict::set(&local_908,0xb,0);
  ParamDict::set(&local_908,0x12,*(int *)(in_RDI + 0xec));
  (**(code **)(**(long **)(in_RDI + 0x428) + 0x10))(*(long **)(in_RDI + 0x428),&local_908);
  local_d20 = &local_9e8;
  do {
    local_558 = local_d20;
    *local_d20 = (void *)0x0;
    local_d20[1] = (void *)0x0;
    local_d20[2] = (void *)0x0;
    *(undefined4 *)(local_d20 + 3) = 0;
    local_d20[4] = (void *)0x0;
    *(undefined4 *)(local_d20 + 5) = 0;
    *(undefined4 *)((long)local_d20 + 0x2c) = 0;
    *(undefined4 *)(local_d20 + 6) = 0;
    *(undefined4 *)((long)local_d20 + 0x34) = 0;
    *(undefined4 *)(local_d20 + 7) = 0;
    local_d20[8] = (void *)0x0;
    local_d20 = local_d20 + 9;
  } while (local_d20 != &pvStack_910);
  local_498 = (void **)(in_RDI + 0x2a0);
  local_490 = &local_9e8;
  if (&local_9e8 != local_498) {
    if (*(long *)(in_RDI + 0x2a8) != 0) {
      piVar2 = *(int **)(in_RDI + 0x2a8);
      local_49c = 1;
      LOCK();
      local_4a0 = *piVar2;
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    local_2c8 = &local_9e8;
    if (local_9e0 != (int *)0x0) {
      local_2cc = 0xffffffff;
      LOCK();
      local_2d0 = *local_9e0;
      *local_9e0 = *local_9e0 + -1;
      UNLOCK();
      if (local_2d0 == 1) {
        if (local_9c8 == (long *)0x0) {
          if (local_9e8 != (void *)0x0) {
            free(local_9e8);
          }
        }
        else {
          (**(code **)(*local_9c8 + 0x18))(local_9c8,local_9e8);
        }
      }
    }
    local_9e8 = *local_498;
    local_9e0 = (int *)local_498[1];
    local_9d8 = local_498[2];
    local_9d0 = *(undefined4 *)(local_498 + 3);
    local_9c8 = (long *)local_498[4];
    local_9c0 = *(undefined4 *)(local_498 + 5);
    local_9bc = *(undefined4 *)((long)local_498 + 0x2c);
    local_9b8 = *(undefined4 *)(local_498 + 6);
    local_9b4 = *(undefined4 *)((long)local_498 + 0x34);
    local_9b0 = *(undefined4 *)(local_498 + 7);
    local_9a8 = local_498[8];
  }
  local_4b8 = (void **)(in_RDI + 0x2e8);
  local_4b0 = &local_9a0;
  local_488 = &local_9e8;
  if (&local_9a0 != local_4b8) {
    if (*(long *)(in_RDI + 0x2f0) != 0) {
      piVar2 = *(int **)(in_RDI + 0x2f0);
      local_4bc = 1;
      LOCK();
      local_4c0 = *piVar2;
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    local_2b8 = &local_9a0;
    if (local_998 != (int *)0x0) {
      local_2bc = 0xffffffff;
      LOCK();
      local_2c0 = *local_998;
      *local_998 = *local_998 + -1;
      UNLOCK();
      if (local_2c0 == 1) {
        if (local_980 == (long *)0x0) {
          if (local_9a0 != (void *)0x0) {
            free(local_9a0);
          }
        }
        else {
          (**(code **)(*local_980 + 0x18))(local_980,local_9a0);
        }
      }
    }
    local_9a0 = *local_4b8;
    local_998 = (int *)local_4b8[1];
    local_990 = local_4b8[2];
    local_988 = *(undefined4 *)(local_4b8 + 3);
    local_980 = (long *)local_4b8[4];
    local_978 = *(undefined4 *)(local_4b8 + 5);
    local_974 = *(undefined4 *)((long)local_4b8 + 0x2c);
    local_970 = *(undefined4 *)(local_4b8 + 6);
    local_96c = *(undefined4 *)((long)local_4b8 + 0x34);
    local_968 = *(undefined4 *)(local_4b8 + 7);
    local_960 = local_4b8[8];
  }
  local_128 = &local_a30;
  local_12c = 1;
  local_138 = 4;
  local_140 = 0;
  local_a30 = (undefined4 *)0x0;
  local_a28 = (int *)0x0;
  local_a20 = 0;
  local_a18 = 0;
  local_a10 = (long *)0x0;
  local_a08 = 0;
  local_a04 = 0;
  local_a00 = 0;
  local_9fc = 0;
  local_9f8 = 0;
  local_9f0 = 0;
  local_4a8 = &local_9a0;
  Mat::create(in_stack_fffffffffffff200,in_stack_fffffffffffff1fc,in_stack_fffffffffffff1f0,
              (Allocator *)CONCAT44(in_stack_fffffffffffff1ec,in_stack_fffffffffffff1e8));
  local_118 = &local_a30;
  local_120 = 0;
  *local_a30 = *(undefined4 *)(in_RDI + 0x408);
  local_4d8 = &local_a30;
  local_4d0 = &local_958;
  if (&local_958 != local_4d8) {
    if (local_a28 != (int *)0x0) {
      local_4dc = 1;
      LOCK();
      local_4e0 = *local_a28;
      *local_a28 = *local_a28 + 1;
      UNLOCK();
    }
    local_2a8 = &local_958;
    if (local_950 != (int *)0x0) {
      local_2ac = 0xffffffff;
      LOCK();
      local_2b0 = *local_950;
      *local_950 = *local_950 + -1;
      UNLOCK();
      if (local_2b0 == 1) {
        if (local_938 == (long *)0x0) {
          if (local_958 != (undefined4 *)0x0) {
            free(local_958);
          }
        }
        else {
          (**(code **)(*local_938 + 0x18))(local_938,local_958);
        }
      }
    }
    local_958 = (undefined4 *)0x0;
    local_948 = (undefined4 *)0x0;
    local_940 = 0;
    local_930 = 0;
    local_92c = 0;
    local_928 = 0;
    local_924 = 0;
    local_920 = 0;
    local_918 = (undefined4 *)0x0;
    local_950 = (int *)0x0;
    local_958 = *local_4d8;
    local_950 = local_4d8[1];
    local_948 = local_4d8[2];
    local_940 = *(undefined4 *)(local_4d8 + 3);
    local_938 = (long *)local_4d8[4];
    local_930 = *(undefined4 *)(local_4d8 + 5);
    local_92c = *(undefined4 *)((long)local_4d8 + 0x2c);
    local_928 = *(undefined4 *)(local_4d8 + 6);
    local_924 = *(undefined4 *)((long)local_4d8 + 0x34);
    local_920 = *(undefined4 *)(local_4d8 + 7);
    local_918 = local_4d8[8];
  }
  plVar1 = *(long **)(in_RDI + 0x428);
  local_4c8 = &local_958;
  ModelBinFromMatArray::ModelBinFromMatArray
            ((ModelBinFromMatArray *)in_stack_fffffffffffff200,
             (Mat *)CONCAT44(in_stack_fffffffffffff1fc,in_stack_fffffffffffff1f8));
  (**(code **)(*plVar1 + 0x18))(plVar1,local_a40);
  ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)in_stack_fffffffffffff1e0);
  (**(code **)(**(long **)(in_RDI + 0x428) + 0x20))(*(long **)(in_RDI + 0x428),&local_5c0);
  if ((local_5c0 & 1) != 0) {
    puVar5 = (undefined8 *)(in_RDI + 0x2a0);
    local_1a8 = puVar5;
    if (*(long *)(in_RDI + 0x2a8) != 0) {
      piVar2 = *(int **)(in_RDI + 0x2a8);
      local_1ac = 0xffffffff;
      LOCK();
      local_1b0 = *piVar2;
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (local_1b0 == 1) {
        if (*(long *)(in_RDI + 0x2c0) == 0) {
          local_e0 = (void *)*puVar5;
          if (local_e0 != (void *)0x0) {
            free(local_e0);
          }
        }
        else {
          (**(code **)(**(long **)(in_RDI + 0x2c0) + 0x18))(*(long **)(in_RDI + 0x2c0),*puVar5);
        }
      }
    }
    *puVar5 = 0;
    *(undefined8 *)(in_RDI + 0x2b0) = 0;
    *(undefined4 *)(in_RDI + 0x2b8) = 0;
    *(undefined4 *)(in_RDI + 0x2c8) = 0;
    *(undefined4 *)(in_RDI + 0x2cc) = 0;
    *(undefined4 *)(in_RDI + 0x2d0) = 0;
    *(undefined4 *)(in_RDI + 0x2d4) = 0;
    *(undefined4 *)(in_RDI + 0x2d8) = 0;
    *(undefined8 *)(in_RDI + 0x2e0) = 0;
    *(undefined8 *)(in_RDI + 0x2a8) = 0;
    puVar5 = (undefined8 *)(in_RDI + 0x2e8);
    local_1b8 = puVar5;
    if (*(long *)(in_RDI + 0x2f0) != 0) {
      piVar2 = *(int **)(in_RDI + 0x2f0);
      local_1bc = 0xffffffff;
      LOCK();
      local_1c0 = *piVar2;
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (local_1c0 == 1) {
        if (*(long *)(in_RDI + 0x308) == 0) {
          local_d8 = (void *)*puVar5;
          if (local_d8 != (void *)0x0) {
            free(local_d8);
          }
        }
        else {
          (**(code **)(**(long **)(in_RDI + 0x308) + 0x18))(*(long **)(in_RDI + 0x308),*puVar5);
        }
      }
    }
    *puVar5 = 0;
    *(undefined8 *)(in_RDI + 0x2f8) = 0;
    *(undefined4 *)(in_RDI + 0x300) = 0;
    *(undefined4 *)(in_RDI + 0x310) = 0;
    *(undefined4 *)(in_RDI + 0x314) = 0;
    *(undefined4 *)(in_RDI + 0x318) = 0;
    *(undefined4 *)(in_RDI + 0x31c) = 0;
    *(undefined4 *)(in_RDI + 800) = 0;
    *(undefined8 *)(in_RDI + 0x328) = 0;
    *(undefined8 *)(in_RDI + 0x2f0) = 0;
  }
  local_500 = &local_a30;
  local_268 = local_500;
  if (local_a28 != (int *)0x0) {
    local_26c = 0xffffffff;
    LOCK();
    local_270 = *local_a28;
    *local_a28 = *local_a28 + -1;
    UNLOCK();
    if (local_270 == 1) {
      if (local_a10 == (long *)0x0) {
        local_80 = local_a30;
        if (local_a30 != (undefined4 *)0x0) {
          free(local_a30);
        }
      }
      else {
        (**(code **)(*local_a10 + 0x18))(local_a10,local_a30);
      }
    }
  }
  local_a30 = (undefined4 *)0x0;
  local_a20 = 0;
  local_a18 = 0;
  local_a08 = 0;
  local_a04 = 0;
  local_a00 = 0;
  local_9fc = 0;
  local_9f8 = 0;
  local_9f0 = 0;
  local_a28 = (int *)0x0;
  local_dc8 = &pvStack_910;
  do {
    ppvVar6 = local_dc8 + -9;
    local_4f0 = ppvVar6;
    local_288 = ppvVar6;
    if (local_dc8[-8] != (void *)0x0) {
      piVar2 = (int *)local_dc8[-8];
      local_28c = 0xffffffff;
      LOCK();
      local_290 = *piVar2;
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (local_290 == 1) {
        if (local_dc8[-5] == (void *)0x0) {
          local_70 = *ppvVar6;
          if (local_70 != (void *)0x0) {
            free(local_70);
          }
        }
        else {
          (**(code **)(*local_dc8[-5] + 0x18))(local_dc8[-5],*ppvVar6);
        }
      }
    }
    *ppvVar6 = (void *)0x0;
    local_dc8[-7] = (void *)0x0;
    *(undefined4 *)(local_dc8 + -6) = 0;
    *(undefined4 *)(local_dc8 + -4) = 0;
    *(undefined4 *)((long)local_dc8 + -0x1c) = 0;
    *(undefined4 *)(local_dc8 + -3) = 0;
    *(undefined4 *)((long)local_dc8 + -0x14) = 0;
    *(undefined4 *)(local_dc8 + -2) = 0;
    local_dc8[-1] = (void *)0x0;
    local_dc8[-8] = (void *)0x0;
    local_dc8 = ppvVar6;
  } while (ppvVar6 != &local_9e8);
  ParamDict::~ParamDict(in_stack_fffffffffffff1e0);
  pLVar4 = create_layer_cpu(in_stack_fffffffffffff1ec);
  *(Layer **)(in_RDI + 0x430) = pLVar4;
  ParamDict::ParamDict((ParamDict *)in_stack_fffffffffffff200);
  ParamDict::set(&local_a50,2,1);
  ParamDict::set(&local_a50,3,0);
  ParamDict::set(&local_a50,4,0);
  ParamDict::set(&local_a50,5,0);
  ParamDict::set(&local_a50,6,(uint)(*(int *)(in_RDI + 0xe4) == 0));
  ParamDict::set(&local_a50,7,0);
  ParamDict::set(&local_a50,8,0);
  ParamDict::set(&local_a50,9,0);
  ParamDict::set(&local_a50,10,-(uint)(*(int *)(in_RDI + 0xe4) == 0) | 3);
  ParamDict::set(&local_a50,0xb,0);
  ParamDict::set(&local_a50,0xc,1);
  ParamDict::set(&local_a50,0x12,*(int *)(in_RDI + 0xec));
  (**(code **)(**(long **)(in_RDI + 0x430) + 0x10))(*(long **)(in_RDI + 0x430),&local_a50);
  plVar1 = *(long **)(in_RDI + 0x430);
  ModelBinFromMatArray::ModelBinFromMatArray
            ((ModelBinFromMatArray *)in_stack_fffffffffffff200,
             (Mat *)CONCAT44(in_stack_fffffffffffff1fc,in_stack_fffffffffffff1f8));
  (**(code **)(*plVar1 + 0x18))(plVar1,local_a60);
  ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)in_stack_fffffffffffff1e0);
  auVar7._1_38_ = auStack_5bf;
  auVar7[0] = local_5c0;
  auVar7[0x27] = uStack_599;
  auVar7._40_24_ = auStack_598;
  auVar7 = vmovdqu64_avx512f(auVar7);
  auVar7 = vmovdqu64_avx512f(auVar7);
  auStack_aa0 = auVar7._8_56_;
  local_aa8 = auVar7._0_4_;
  uStack_aa4 = 1;
  (**(code **)(**(long **)(in_RDI + 0x430) + 0x20))(*(long **)(in_RDI + 0x430),&local_aa8);
  ParamDict::~ParamDict(in_stack_fffffffffffff1e0);
  pLVar4 = create_layer_cpu(in_stack_fffffffffffff1ec);
  *(Layer **)(in_RDI + 0x438) = pLVar4;
  ParamDict::ParamDict((ParamDict *)in_stack_fffffffffffff200);
  ParamDict::set(&local_ab8,2,0);
  ParamDict::set(&local_ab8,3,1);
  ParamDict::set(&local_ab8,4,0);
  ParamDict::set(&local_ab8,5,0);
  ParamDict::set(&local_ab8,6,1);
  ParamDict::set(&local_ab8,7,0);
  ParamDict::set(&local_ab8,8,0);
  ParamDict::set(&local_ab8,9,0);
  ParamDict::set(&local_ab8,10,-1);
  ParamDict::set(&local_ab8,0xb,0);
  ParamDict::set(&local_ab8,0xc,1);
  ParamDict::set(&local_ab8,0xe,1);
  ParamDict::set(&local_ab8,0x12,*(int *)(in_RDI + 0xec));
  (**(code **)(**(long **)(in_RDI + 0x438) + 0x10))(*(long **)(in_RDI + 0x438),&local_ab8);
  this_00 = *(ModelBinFromMatArray **)(in_RDI + 0x438);
  ModelBinFromMatArray::ModelBinFromMatArray
            (this_00,(Mat *)CONCAT44(in_stack_fffffffffffff1fc,in_stack_fffffffffffff1f8));
  (*(this_00->super_ModelBin)._vptr_ModelBin[3])(this_00,local_ac8);
  ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)in_stack_fffffffffffff1e0);
  auVar3._1_38_ = auStack_5bf;
  auVar3[0] = local_5c0;
  auVar3[0x27] = uStack_599;
  auVar3._40_24_ = auStack_598;
  auVar7 = vmovdqu64_avx512f(auVar3);
  auVar7 = vmovdqu64_avx512f(auVar7);
  auStack_b00 = auVar7._8_56_;
  local_b08 = auVar7._0_4_;
  uStack_b04 = 1;
  (**(code **)(**(long **)(in_RDI + 0x438) + 0x20))(*(long **)(in_RDI + 0x438),&local_b08);
  ParamDict::~ParamDict(in_stack_fffffffffffff1e0);
  return 0;
}

Assistant:

int MultiHeadAttention_x86_avx512::create_pipeline(const Option& _opt)
{
    Option opt = _opt;
    if (int8_scale_term)
    {
        support_packing = false;

        opt.use_packing_layout = false; // TODO enable packing
    }

    {
        qk_softmax = ncnn::create_layer_cpu(ncnn::LayerType::Softmax);
        ncnn::ParamDict pd;
        pd.set(0, -1);
        pd.set(1, 1);
        qk_softmax->load_param(pd);
        qk_softmax->load_model(ModelBinFromMatArray(0));
        qk_softmax->create_pipeline(opt);
    }

    const int qdim = weight_data_size / embed_dim;

    {
        q_gemm = ncnn::create_layer_cpu(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(0, scale);
        pd.set(1, 1.f);
        pd.set(2, 0);         // transA
        pd.set(3, 1);         // transB
        pd.set(4, 1);         // constantA
        pd.set(5, 0);         // constantB
        pd.set(6, 1);         // constantC
        pd.set(7, embed_dim); // M
        pd.set(8, 0);         // N
        pd.set(9, qdim);      // K
        pd.set(10, 1);        // constant_broadcast_type_C
        pd.set(11, 0);        // output_N1M
        pd.set(12, 1);        // output_elempack
        pd.set(14, 0);        // output_transpose
#if NCNN_INT8
        pd.set(18, int8_scale_term);
#endif
        q_gemm->load_param(pd);
        Mat weights[3];
        weights[0] = q_weight_data;
        weights[1] = q_bias_data;
#if NCNN_INT8
        weights[2] = q_weight_data_int8_scales;
#endif
        q_gemm->load_model(ModelBinFromMatArray(weights));
        q_gemm->create_pipeline(opt);

        if (opt.lightmode)
        {
            q_weight_data.release();
            q_bias_data.release();
        }
    }

    {
        k_gemm = ncnn::create_layer_cpu(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(2, 0);         // transA
        pd.set(3, 1);         // transB
        pd.set(4, 1);         // constantA
        pd.set(5, 0);         // constantB
        pd.set(6, 1);         // constantC
        pd.set(7, embed_dim); // M
        pd.set(8, 0);         // N
        pd.set(9, kdim);      // K
        pd.set(10, 1);        // constant_broadcast_type_C
        pd.set(11, 0);        // output_N1M
        pd.set(12, 1);        // output_elempack
        pd.set(14, 0);        // output_transpose
#if NCNN_INT8
        pd.set(18, int8_scale_term);
#endif
        k_gemm->load_param(pd);
        Mat weights[3];
        weights[0] = k_weight_data;
        weights[1] = k_bias_data;
#if NCNN_INT8
        weights[2] = k_weight_data_int8_scales;
#endif
        k_gemm->load_model(ModelBinFromMatArray(weights));
        k_gemm->create_pipeline(opt);

        if (opt.lightmode)
        {
            k_weight_data.release();
            k_bias_data.release();
        }
    }

    {
        v_gemm = ncnn::create_layer_cpu(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(2, 0);         // transA
        pd.set(3, 1);         // transB
        pd.set(4, 1);         // constantA
        pd.set(5, 0);         // constantB
        pd.set(6, 1);         // constantC
        pd.set(7, embed_dim); // M
        pd.set(8, 0);         // N
        pd.set(9, vdim);      // K
        pd.set(10, 1);        // constant_broadcast_type_C
        pd.set(11, 0);        // output_N1M
        pd.set(12, 1);        // output_elempack
        pd.set(14, 0);        // output_transpose
#if NCNN_INT8
        pd.set(18, int8_scale_term);
#endif
        v_gemm->load_param(pd);
        Mat weights[3];
        weights[0] = v_weight_data;
        weights[1] = v_bias_data;
#if NCNN_INT8
        weights[2] = v_weight_data_int8_scales;
#endif
        v_gemm->load_model(ModelBinFromMatArray(weights));
        v_gemm->create_pipeline(opt);

        if (opt.lightmode)
        {
            v_weight_data.release();
            v_bias_data.release();
        }
    }

    {
        o_gemm = ncnn::create_layer_cpu(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(2, 1);         // transA
        pd.set(3, 1);         // transB
        pd.set(4, 0);         // constantA
        pd.set(5, 1);         // constantB
        pd.set(6, 1);         // constantC
        pd.set(7, 0);         // M = outch
        pd.set(8, qdim);      // N = size
        pd.set(9, embed_dim); // K = maxk*inch
        pd.set(10, 4);        // constant_broadcast_type_C
        pd.set(11, 0);        // output_N1M
#if NCNN_INT8
        pd.set(18, int8_scale_term);
#endif
        o_gemm->load_param(pd);
        Mat weights[3];
        weights[0] = out_weight_data;
        weights[1] = out_bias_data;
#if NCNN_INT8
        Mat out_weight_data_int8_scales(1);
        out_weight_data_int8_scales[0] = out_weight_data_int8_scale;
        weights[2] = out_weight_data_int8_scales;
#endif
        o_gemm->load_model(ModelBinFromMatArray(weights));
        o_gemm->create_pipeline(opt);

        if (opt.lightmode)
        {
            out_weight_data.release();
            out_bias_data.release();
        }
    }

    {
        qk_gemm = ncnn::create_layer_cpu(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(2, 1);                   // transA
        pd.set(3, 0);                   // transB
        pd.set(4, 0);                   // constantA
        pd.set(5, 0);                   // constantB
        pd.set(6, attn_mask ? 0 : 1);   // constantC
        pd.set(7, 0);                   // M
        pd.set(8, 0);                   // N
        pd.set(9, 0);                   // K
        pd.set(10, attn_mask ? 3 : -1); // constant_broadcast_type_C
        pd.set(11, 0);                  // output_N1M
        pd.set(12, 1);                  // output_elempack
#if NCNN_INT8
        pd.set(18, int8_scale_term);
#endif
        qk_gemm->load_param(pd);
        qk_gemm->load_model(ModelBinFromMatArray(0));
        Option opt1 = opt;
        opt1.num_threads = 1;
        qk_gemm->create_pipeline(opt1);
    }

    {
        qkv_gemm = ncnn::create_layer_cpu(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(2, 0);   // transA
        pd.set(3, 1);   // transB
        pd.set(4, 0);   // constantA
        pd.set(5, 0);   // constantB
        pd.set(6, 1);   // constantC
        pd.set(7, 0);   // M
        pd.set(8, 0);   // N
        pd.set(9, 0);   // K
        pd.set(10, -1); // constant_broadcast_type_C
        pd.set(11, 0);  // output_N1M
        pd.set(12, 1);  // output_elempack
        pd.set(14, 1);  // output_transpose
#if NCNN_INT8
        pd.set(18, int8_scale_term);
#endif
        qkv_gemm->load_param(pd);
        qkv_gemm->load_model(ModelBinFromMatArray(0));
        Option opt1 = opt;
        opt1.num_threads = 1;
        qkv_gemm->create_pipeline(opt1);
    }

    return 0;
}